

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_dc_predictor_4x8_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  ulong uVar10;
  ulong uVar11;
  uint5 uVar12;
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  int iVar16;
  
  uVar1 = *(uint *)above;
  auVar3[0xc] = (char)(uVar1 >> 0x18);
  auVar3._0_12_ = ZEXT712(0);
  uVar12 = CONCAT32(auVar3._10_3_,(ushort)(byte)(uVar1 >> 0x10));
  auVar15._5_8_ = 0;
  auVar15._0_5_ = uVar12;
  uVar2 = *(undefined4 *)left;
  uVar10 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar10;
  auVar4[0xc] = (char)((uint)uVar2 >> 0x18);
  auVar5[8] = (char)((uint)uVar2 >> 0x10);
  auVar5._0_8_ = uVar10;
  auVar5[9] = 0;
  auVar5._10_3_ = auVar4._10_3_;
  auVar13._5_8_ = 0;
  auVar13._0_5_ = auVar5._8_5_;
  auVar6[4] = (char)((uint)uVar2 >> 8);
  auVar6._0_4_ = (int)uVar10;
  auVar6[5] = 0;
  auVar6._6_7_ = SUB137(auVar13 << 0x40,6);
  uVar2 = *(undefined4 *)(left + 4);
  uVar11 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar11;
  auVar7[0xc] = (char)((uint)uVar2 >> 0x18);
  auVar8[8] = (char)((uint)uVar2 >> 0x10);
  auVar8._0_8_ = uVar11;
  auVar8[9] = 0;
  auVar8._10_3_ = auVar7._10_3_;
  auVar14._5_8_ = 0;
  auVar14._0_5_ = auVar8._8_5_;
  auVar9[4] = (char)((uint)uVar2 >> 8);
  auVar9._0_4_ = (int)uVar11;
  auVar9[5] = 0;
  auVar9._6_7_ = SUB137(auVar14 << 0x40,6);
  iVar16 = 8;
  do {
    *(uint *)dst = (((uint)(uint3)(auVar7._10_3_ >> 0x10) + (uint)(uint3)(auVar4._10_3_ >> 0x10) +
                     auVar9._4_4_ + auVar6._4_4_ +
                     auVar8._8_4_ + auVar5._8_4_ +
                     (int)uVar11 + (int)uVar10 +
                     (uint)(uint3)(auVar3._10_3_ >> 0x10) +
                     (int)CONCAT72(SUB137(auVar15 << 0x40,6),(ushort)(byte)(uVar1 >> 8)) +
                     (int)uVar12 + (uVar1 & 0xff) + 6 >> 2) * 0x5556 >> 0x10 & 0xff) * 0x1010101;
    dst = (uint8_t *)((long)dst + stride);
    iVar16 = iVar16 + -1;
  } while (iVar16 != 0);
  return;
}

Assistant:

static inline void dc_predictor_rect(uint8_t *dst, ptrdiff_t stride, int bw,
                                     int bh, const uint8_t *above,
                                     const uint8_t *left, int shift1,
                                     int multiplier) {
  int sum = 0;

  for (int i = 0; i < bw; i++) {
    sum += above[i];
  }
  for (int i = 0; i < bh; i++) {
    sum += left[i];
  }

  const int expected_dc = divide_using_multiply_shift(
      sum + ((bw + bh) >> 1), shift1, multiplier, DC_SHIFT2);
  assert(expected_dc < (1 << 8));

  for (int r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}